

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

char * mcpl_usage_progname(char *argv0)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *__s1;
  
  pcVar2 = mcpl_basename(argv0);
  sVar3 = strlen(pcVar2);
  if (sVar3 < 5) {
    if (sVar3 == 0) goto LAB_00105f69;
  }
  else {
    __s1 = pcVar2 + (sVar3 - 4);
    iVar1 = strcmp(__s1,".exe");
    if ((iVar1 == 0) || (iVar1 = strcmp(__s1,".EXE"), iVar1 == 0)) {
      *__s1 = '\0';
    }
  }
  if (*pcVar2 != '.') {
    return pcVar2;
  }
LAB_00105f69:
  free(pcVar2);
  pcVar2 = mcpl_internal_malloc(9);
  builtin_strncpy(pcVar2,"PROGNAME",9);
  return pcVar2;
}

Assistant:

char* mcpl_usage_progname( const char * argv0 )
{
  //Basically return the basename, but with any trailing .exe/.EXE discarded.
  char * bn = mcpl_basename(argv0);
  size_t npn = strlen(bn);
  const int has_exe_suffix = ( npn > 4
                               && ( strcmp(bn+(npn-4),".exe")==0
                                    || strcmp(bn+(npn-4),".EXE")==0 ) );
  if ( has_exe_suffix ) {
    npn -= 4;
    bn[npn] = '\0';
  }
  //Fallback to PROGNAME if empty or starts with a dot:
  if ( npn == 0 || bn[0]=='.' ) {
    free(bn);
    bn = mcpl_internal_malloc(9);
    memcpy(bn,"PROGNAME",9);
  }
  return bn;
}